

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

bool __thiscall Escape::CGraph::isEdgeBinary(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  EdgeIdx EVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = this->offsets[v1 + 1] + -1;
  EVar1 = this->offsets[v1];
  while (lVar4 = EVar1, lVar4 <= lVar3) {
    lVar2 = (lVar3 + lVar4) / 2;
    if (this->nbors[lVar2] == v2) break;
    EVar1 = lVar2 + 1;
    if (v2 < this->nbors[lVar2]) {
      lVar3 = lVar2 + -1;
      EVar1 = lVar4;
    }
  }
  return lVar4 <= lVar3;
}

Assistant:

bool CGraph::isEdgeBinary(VertexIdx v1, VertexIdx v2) const {
//     VertexIdx deg1 = offsets[v1+1] - offsets[v1];
//     VertexIdx deg2 = offsets[v2+1] - offsets[v2];

//     if(deg2 < deg1)
//     {
//         VertexIdx swp = v1;
//         v1 = v2;
//         v2 = swp;
//     }
//
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;

    while (low <= high) {
        mid = (low + high) / 2;

        if (nbors[mid] == v2)
            return true;
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return false;
}